

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord> * __thiscall
QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>::operator=
          (QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord> *this,
          QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord> *other)

{
  Data *pDVar1;
  Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
  *this_00;
  Data *pDVar2;
  Data *o;
  
  pDVar2 = this->d;
  pDVar1 = other->d;
  if (pDVar2 != pDVar1) {
    if ((pDVar1 != (Data *)0x0) &&
       ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
      LOCK();
      (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pDVar2 = this->d;
    }
    if ((pDVar2 != (Data *)0x0) &&
       ((pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
      LOCK();
      (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        this_00 = this->d;
        if (this_00 !=
            (Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
             *)0x0) {
          QHashPrivate::
          Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
          ::~Data(this_00);
        }
        operator_delete(this_00,0x28);
      }
    }
    this->d = pDVar1;
  }
  return this;
}

Assistant:

QHash &operator=(const QHash &other) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (d != other.d) {
            Data *o = other.d;
            if (o)
                o->ref.ref();
            if (d && !d->ref.deref())
                delete d;
            d = o;
        }
        return *this;
    }